

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall
wasm::WasmBinaryWriter::writeHeapType(WasmBinaryWriter *this,HeapType type,Exactness exactness)

{
  BufferWithRandomAccess *pBVar1;
  bool bVar2;
  BasicHeapType BVar3;
  uint32_t uVar4;
  S64LEB local_48;
  int local_3c;
  WasmBinaryWriter *pWStack_38;
  int ret;
  S64LEB local_30;
  HeapType local_28;
  Exactness local_1c;
  WasmBinaryWriter *pWStack_18;
  Exactness exactness_local;
  WasmBinaryWriter *this_local;
  HeapType type_local;
  
  local_1c = exactness;
  pWStack_18 = this;
  this_local = (WasmBinaryWriter *)type.id;
  bVar2 = FeatureSet::hasCustomDescriptors(&this->wasm->features);
  if (!bVar2) {
    local_1c = Inexact;
  }
  bVar2 = FeatureSet::hasGC(&this->wasm->features);
  if (!bVar2) {
    BVar3 = HeapType::getTop((HeapType *)&this_local);
    HeapType::HeapType(&local_28,BVar3);
    this_local = (WasmBinaryWriter *)local_28.id;
  }
  bVar2 = HeapType::isBasic((HeapType *)&this_local);
  if (bVar2 && local_1c != Inexact) {
    __assert_fail("!type.isBasic() || exactness == Inexact",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x699,"void wasm::WasmBinaryWriter::writeHeapType(HeapType, Exactness)");
  }
  if (local_1c == Exact) {
    BufferWithRandomAccess::operator<<(this->o,'b');
  }
  bVar2 = HeapType::isBasic((HeapType *)&this_local);
  if (bVar2) {
    local_3c = 0;
    bVar2 = HeapType::isShared((HeapType *)&this_local);
    if (bVar2) {
      BufferWithRandomAccess::operator<<(this->o,'e');
    }
    BVar3 = HeapType::getBasic((HeapType *)&this_local,Unshared);
    switch(BVar3) {
    case ext:
      local_3c = -0x11;
      break;
    case func:
      local_3c = -0x10;
      break;
    case cont:
      local_3c = -0x18;
      break;
    case any:
      local_3c = -0x12;
      break;
    case eq:
      local_3c = -0x13;
      break;
    case i31:
      local_3c = -0x14;
      break;
    case struct_:
      local_3c = -0x15;
      break;
    case array:
      local_3c = -0x16;
      break;
    case exn:
      local_3c = -0x17;
      break;
    case string:
      local_3c = -0x19;
      break;
    case none:
      local_3c = -0xf;
      break;
    case noext:
      local_3c = -0xe;
      break;
    case nofunc:
      local_3c = -0xd;
      break;
    case nocont:
      local_3c = -0xb;
      break;
    case noexn:
      local_3c = -0xc;
    }
    pBVar1 = this->o;
    LEB<long,_signed_char>::LEB(&local_48,(long)local_3c);
    BufferWithRandomAccess::operator<<(pBVar1,local_48);
  }
  else {
    pBVar1 = this->o;
    pWStack_38 = this_local;
    uVar4 = getTypeIndex(this,(HeapType)this_local);
    LEB<long,_signed_char>::LEB(&local_30,(ulong)uVar4);
    BufferWithRandomAccess::operator<<(pBVar1,local_30);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeHeapType(HeapType type, Exactness exactness) {
  // ref.null always has a bottom heap type in Binaryen IR, but those types are
  // only actually valid with GC. Otherwise, emit the corresponding valid top
  // types instead.
  if (!wasm->features.hasCustomDescriptors()) {
    exactness = Inexact;
  }
  if (!wasm->features.hasGC()) {
    type = type.getTop();
  }
  assert(!type.isBasic() || exactness == Inexact);
  if (exactness == Exact) {
    o << uint8_t(BinaryConsts::EncodedType::Exact);
  }
  if (!type.isBasic()) {
    o << S64LEB(getTypeIndex(type)); // TODO: Actually s33
    return;
  }

  int ret = 0;
  if (type.isShared()) {
    o << uint8_t(BinaryConsts::EncodedType::Shared);
  }
  switch (type.getBasic(Unshared)) {
    case HeapType::ext:
      ret = BinaryConsts::EncodedHeapType::ext;
      break;
    case HeapType::func:
      ret = BinaryConsts::EncodedHeapType::func;
      break;
    case HeapType::cont:
      ret = BinaryConsts::EncodedHeapType::cont;
      break;
    case HeapType::any:
      ret = BinaryConsts::EncodedHeapType::any;
      break;
    case HeapType::eq:
      ret = BinaryConsts::EncodedHeapType::eq;
      break;
    case HeapType::i31:
      ret = BinaryConsts::EncodedHeapType::i31;
      break;
    case HeapType::struct_:
      ret = BinaryConsts::EncodedHeapType::struct_;
      break;
    case HeapType::array:
      ret = BinaryConsts::EncodedHeapType::array;
      break;
    case HeapType::exn:
      ret = BinaryConsts::EncodedHeapType::exn;
      break;
    case HeapType::string:
      ret = BinaryConsts::EncodedHeapType::string;
      break;
    case HeapType::none:
      ret = BinaryConsts::EncodedHeapType::none;
      break;
    case HeapType::noext:
      ret = BinaryConsts::EncodedHeapType::noext;
      break;
    case HeapType::nofunc:
      ret = BinaryConsts::EncodedHeapType::nofunc;
      break;
    case HeapType::noexn:
      ret = BinaryConsts::EncodedHeapType::noexn;
      break;
    case HeapType::nocont:
      ret = BinaryConsts::EncodedHeapType::nocont;
      break;
  }
  o << S64LEB(ret); // TODO: Actually s33
}